

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_pcm_seek(OggVorbis_File *vf,ogg_int64_t pos)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ogg_int64_t oVar4;
  byte bVar5;
  long local_a8;
  long samples;
  ogg_int64_t target;
  int hs;
  int link;
  long serialno;
  int i;
  int ret_1;
  ogg_page og;
  ogg_packet op;
  int local_28;
  int ret;
  int lastblock;
  int thisblock;
  ogg_int64_t pos_local;
  OggVorbis_File *vf_local;
  
  local_28 = 0;
  vf_local._4_4_ = ov_pcm_seek_page(vf,pos);
  if ((vf_local._4_4_ < 0) || (vf_local._4_4_ = _make_decode_ready(vf), vf_local._4_4_ != 0)) {
    return vf_local._4_4_;
  }
LAB_0024f689:
  while (iVar1 = ogg_stream_packetpeek(&vf->os,(ogg_packet *)&og.body_len), 0 < iVar1) {
    lVar3 = vorbis_packet_blocksize(vf->vi + vf->current_link,(ogg_packet *)&og.body_len);
    iVar1 = (int)lVar3;
    if (iVar1 < 0) {
      ogg_stream_packetout(&vf->os,(ogg_packet *)0x0);
    }
    else {
      if (local_28 != 0) {
        vf->pcm_offset = (long)(local_28 + iVar1 >> 2) + vf->pcm_offset;
      }
      lVar3 = vf->pcm_offset;
      iVar2 = vorbis_info_blocksize(vf->vi,1);
      if (pos <= lVar3 + (iVar1 + iVar2 >> 2)) goto LAB_0024f989;
      ogg_stream_packetout(&vf->os,(ogg_packet *)0x0);
      vorbis_synthesis_trackonly(&vf->vb,(ogg_packet *)&og.body_len);
      vorbis_synthesis_blockin(&vf->vd,&vf->vb);
      local_28 = iVar1;
      if (-1 < op.e_o_s) {
        vf->pcm_offset = op.e_o_s - vf->pcmlengths[vf->current_link << 1];
        if (vf->pcm_offset < 0) {
          vf->pcm_offset = 0;
        }
        for (serialno._0_4_ = 0; (int)serialno < vf->current_link;
            serialno._0_4_ = (int)serialno + 1) {
          vf->pcm_offset = vf->pcmlengths[(int)serialno * 2 + 1] + vf->pcm_offset;
        }
      }
    }
  }
  if (((iVar1 < 0) && (iVar1 != -3)) || (oVar4 = _get_next_page(vf,(ogg_page *)&i,-1), oVar4 < 0)) {
LAB_0024f989:
    vf->bittrack = 0.0;
    vf->samptrack = 0.0;
    iVar1 = vorbis_synthesis_halfrate_p(vf->vi);
    while (bVar5 = (byte)iVar1, vf->pcm_offset < (pos >> (bVar5 & 0x3f)) << (bVar5 & 0x3f)) {
      lVar3 = pos - vf->pcm_offset >> (bVar5 & 0x3f);
      iVar2 = vorbis_synthesis_pcmout(&vf->vd,(float ***)0x0);
      local_a8 = (long)iVar2;
      if (lVar3 < iVar2) {
        local_a8 = lVar3;
      }
      vorbis_synthesis_read(&vf->vd,(int)local_a8);
      vf->pcm_offset = (local_a8 << (bVar5 & 0x3f)) + vf->pcm_offset;
      if ((local_a8 < lVar3) &&
         (iVar2 = _fetch_and_process_packet(vf,(ogg_packet *)0x0,1,1), iVar2 < 1)) {
        oVar4 = ov_pcm_total(vf,-1);
        vf->pcm_offset = oVar4;
      }
    }
    return 0;
  }
  iVar1 = ogg_page_bos((ogg_page *)&i);
  if (iVar1 != 0) {
    _decode_clear(vf);
  }
  if (vf->ready_state < 3) {
    iVar1 = ogg_page_serialno((ogg_page *)&i);
    for (target._4_4_ = 0;
        (target._4_4_ < vf->links && (vf->serialnos[target._4_4_] != (long)iVar1));
        target._4_4_ = target._4_4_ + 1) {
    }
    if (target._4_4_ == vf->links) goto LAB_0024f689;
    vf->current_link = target._4_4_;
    vf->ready_state = 3;
    iVar2 = ogg_page_serialno((ogg_page *)&i);
    vf->current_serialno = (long)iVar2;
    ogg_stream_reset_serialno(&vf->os,iVar1);
    iVar1 = _make_decode_ready(vf);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_28 = 0;
  }
  ogg_stream_pagein(&vf->os,(ogg_page *)&i);
  goto LAB_0024f689;
}

Assistant:

int ov_pcm_seek(OggVorbis_File *vf,ogg_int64_t pos){
  int thisblock,lastblock=0;
  int ret=ov_pcm_seek_page(vf,pos);
  if(ret<0)return(ret);
  if((ret=_make_decode_ready(vf)))return ret;

  /* discard leading packets we don't need for the lapping of the
     position we want; don't decode them */

  while(1){
    ogg_packet op;
    ogg_page og;

    int ret=ogg_stream_packetpeek(&vf->os,&op);
    if(ret>0){
      thisblock=vorbis_packet_blocksize(vf->vi+vf->current_link,&op);
      if(thisblock<0){
        ogg_stream_packetout(&vf->os,NULL);
        continue; /* non audio packet */
      }
      if(lastblock)vf->pcm_offset+=(lastblock+thisblock)>>2;

      if(vf->pcm_offset+((thisblock+
                          vorbis_info_blocksize(vf->vi,1))>>2)>=pos)break;

      /* remove the packet from packet queue and track its granulepos */
      ogg_stream_packetout(&vf->os,NULL);
      vorbis_synthesis_trackonly(&vf->vb,&op);  /* set up a vb with
                                                   only tracking, no
                                                   pcm_decode */
      vorbis_synthesis_blockin(&vf->vd,&vf->vb);

      /* end of logical stream case is hard, especially with exact
         length positioning. */

      if(op.granulepos>-1){
        int i;
        /* always believe the stream markers */
        vf->pcm_offset=op.granulepos-vf->pcmlengths[vf->current_link*2];
        if(vf->pcm_offset<0)vf->pcm_offset=0;
        for(i=0;i<vf->current_link;i++)
          vf->pcm_offset+=vf->pcmlengths[i*2+1];
      }

      lastblock=thisblock;

    }else{
      if(ret<0 && ret!=OV_HOLE)break;

      /* suck in a new page */
      if(_get_next_page(vf,&og,-1)<0)break;
      if(ogg_page_bos(&og))_decode_clear(vf);

      if(vf->ready_state<STREAMSET){
        long serialno=ogg_page_serialno(&og);
        int link;

        for(link=0;link<vf->links;link++)
          if(vf->serialnos[link]==serialno)break;
        if(link==vf->links) continue;
        vf->current_link=link;

        vf->ready_state=STREAMSET;
        vf->current_serialno=ogg_page_serialno(&og);
        ogg_stream_reset_serialno(&vf->os,serialno);
        ret=_make_decode_ready(vf);
        if(ret)return ret;
        lastblock=0;
      }

      ogg_stream_pagein(&vf->os,&og);
    }
  }

  vf->bittrack=0.f;
  vf->samptrack=0.f;
  /* discard samples until we reach the desired position. Crossing a
     logical bitstream boundary with abandon is OK. */
  {
    /* note that halfrate could be set differently in each link, but
       vorbisfile encoforces all links are set or unset */
    int hs=vorbis_synthesis_halfrate_p(vf->vi);
    while(vf->pcm_offset<((pos>>hs)<<hs)){
      ogg_int64_t target=(pos-vf->pcm_offset)>>hs;
      long samples=vorbis_synthesis_pcmout(&vf->vd,NULL);

      if(samples>target)samples=target;
      vorbis_synthesis_read(&vf->vd,samples);
      vf->pcm_offset+=samples<<hs;

      if(samples<target)
        if(_fetch_and_process_packet(vf,NULL,1,1)<=0)
          vf->pcm_offset=ov_pcm_total(vf,-1); /* eof */
    }
  }
  return 0;
}